

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,if_statement *s)

{
  bool bVar1;
  expression *e_00;
  statement *psVar2;
  statement *e;
  value local_70;
  value local_48;
  if_statement *local_20;
  if_statement *s_local;
  impl *this_local;
  
  local_20 = s;
  s_local = (if_statement *)this;
  this_local = (impl *)__return_storage_ptr__;
  e_00 = if_statement::cond(s);
  eval(&local_70,this,e_00);
  get_value(&local_48,this,&local_70);
  bVar1 = to_boolean(&local_48);
  value::~value(&local_48);
  value::~value(&local_70);
  if (bVar1) {
    psVar2 = if_statement::if_s(local_20);
    eval(__return_storage_ptr__,this,psVar2);
  }
  else {
    psVar2 = if_statement::else_s(local_20);
    if (psVar2 == (statement *)0x0) {
      completion::completion(__return_storage_ptr__,(value *)value::undefined,normal);
    }
    else {
      eval(__return_storage_ptr__,this,psVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const if_statement& s) {
        if (to_boolean(get_value(eval(s.cond())))) {
            return eval(s.if_s());
        } else if (auto e = s.else_s()) {
            return eval(*e);
        }
        return completion{};
    }